

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

void __thiscall
QArrayDataPointer<QItemSelectionRange>::reallocateAndGrow
          (QArrayDataPointer<QItemSelectionRange> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<QItemSelectionRange> *old)

{
  undefined8 *puVar1;
  QItemSelectionRange *pQVar2;
  undefined8 uVar3;
  Data *pDVar4;
  bool bVar5;
  long lVar6;
  undefined1 *puVar7;
  long lVar8;
  long in_FS_OFFSET;
  QArrayDataPointer<QItemSelectionRange> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (old == (QArrayDataPointer<QItemSelectionRange> *)0x0 && where == GrowsAtEnd) {
    pDVar4 = this->d;
    if (pDVar4 == (Data *)0x0) {
      bVar5 = true;
    }
    else {
      bVar5 = 1 < (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
    }
    if ((0 < n) && (!bVar5)) {
      if (pDVar4 == (Data *)0x0) {
        lVar6 = 0;
        lVar8 = 0;
      }
      else {
        lVar6 = (pDVar4->super_QArrayData).alloc;
        lVar8 = (this->size - (pDVar4->super_QArrayData).alloc) +
                ((long)((long)this->ptr -
                       ((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0))
                >> 4);
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        QtPrivate::QMovableArrayOps<QItemSelectionRange>::reallocate
                  ((QMovableArrayOps<QItemSelectionRange> *)this,lVar6 + n + lVar8,Grow);
        return;
      }
      goto LAB_00473cd4;
    }
  }
  local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.ptr = (QItemSelectionRange *)&DAT_aaaaaaaaaaaaaaaa;
  allocateGrow(&local_38,this,n,where);
  if ((n < 1) || (local_38.ptr != (QItemSelectionRange *)0x0)) {
    puVar7 = (undefined1 *)local_38.size;
    if (this->size != 0) {
      lVar6 = this->size + (n >> 0x3f & n);
      if (this->d == (Data *)0x0) {
        bVar5 = true;
      }
      else {
        bVar5 = 1 < (this->d->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
      }
      pQVar2 = this->ptr;
      if ((old != (QArrayDataPointer<QItemSelectionRange> *)0x0) || (bVar5)) {
        QtPrivate::QGenericArrayOps<QItemSelectionRange>::copyAppend
                  ((QGenericArrayOps<QItemSelectionRange> *)&local_38,pQVar2,pQVar2 + lVar6);
        puVar7 = (undefined1 *)local_38.size;
      }
      else if ((lVar6 != 0) && (0 < lVar6)) {
        lVar8 = 0;
        do {
          puVar1 = (undefined8 *)((long)&(pQVar2->tl).d + lVar8);
          uVar3 = *puVar1;
          *puVar1 = 0;
          *(undefined8 *)((long)&local_38.ptr[local_38.size].tl.d + lVar8) = uVar3;
          uVar3 = puVar1[1];
          puVar1[1] = 0;
          *(undefined8 *)((long)&local_38.ptr[local_38.size].br.d + lVar8) = uVar3;
          puVar7 = puVar7 + 1;
          lVar8 = lVar8 + 0x10;
        } while ((QItemSelectionRange *)(puVar1 + 2) < pQVar2 + lVar6);
      }
    }
    local_38.size = (qsizetype)puVar7;
    pDVar4 = this->d;
    pQVar2 = this->ptr;
    this->d = local_38.d;
    this->ptr = local_38.ptr;
    puVar7 = (undefined1 *)this->size;
    this->size = local_38.size;
    local_38.d = pDVar4;
    local_38.ptr = pQVar2;
    local_38.size = (qsizetype)puVar7;
    if (old != (QArrayDataPointer<QItemSelectionRange> *)0x0) {
      local_38.d = old->d;
      local_38.ptr = old->ptr;
      old->d = pDVar4;
      old->ptr = pQVar2;
      local_38.size = old->size;
      old->size = (qsizetype)puVar7;
    }
    ~QArrayDataPointer(&local_38);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    qBadAlloc();
  }
LAB_00473cd4:
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }